

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_elements_block.cpp
# Opt level: O0

BlockTxDataStruct *
cfd::js::api::ElementsBlockStructApi::GetTxDataFromBlock
          (BlockTxDataStruct *__return_storage_ptr__,BlockTxRequestStruct *request)

{
  BlockTxRequestStruct *this;
  string *in_R8;
  allocator local_149;
  function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)> local_148;
  undefined1 local_128 [270];
  undefined1 local_1a;
  anon_class_1_0_00000001 local_19;
  BlockTxRequestStruct *pBStack_18;
  anon_class_1_0_00000001 call_func;
  BlockTxRequestStruct *request_local;
  BlockTxDataStruct *result;
  
  local_1a = 0;
  pBStack_18 = request;
  BlockTxDataStruct::BlockTxDataStruct(__return_storage_ptr__);
  this = pBStack_18;
  std::function<cfd::js::api::BlockTxDataStruct(cfd::js::api::BlockTxRequestStruct_const&)>::
  function<cfd::js::api::ElementsBlockStructApi::GetTxDataFromBlock(cfd::js::api::BlockTxRequestStruct_const&)::__0&,void>
            ((function<cfd::js::api::BlockTxDataStruct(cfd::js::api::BlockTxRequestStruct_const&)> *
             )local_128,&local_19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_148,"GetTxDataFromBlock",&local_149);
  ExecuteStructApi<cfd::js::api::BlockTxRequestStruct,cfd::js::api::BlockTxDataStruct>
            ((BlockTxDataStruct *)(local_128 + 0x20),(api *)this,(BlockTxRequestStruct *)local_128,
             &local_148,in_R8);
  BlockTxDataStruct::operator=(__return_storage_ptr__,(BlockTxDataStruct *)(local_128 + 0x20));
  BlockTxDataStruct::~BlockTxDataStruct((BlockTxDataStruct *)(local_128 + 0x20));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)>::
  ~function((function<cfd::js::api::BlockTxDataStruct_(const_cfd::js::api::BlockTxRequestStruct_&)>
             *)local_128);
  return __return_storage_ptr__;
}

Assistant:

BlockTxDataStruct ElementsBlockStructApi::GetTxDataFromBlock(
    const BlockTxRequestStruct& request) {
  auto call_func =
      [](const BlockTxRequestStruct& request) -> BlockTxDataStruct {
    warn(CFD_LOG_SOURCE, "not implements. txidLen:{}", request.txid.size());
    throw CfdException(CfdError::kCfdIllegalStateError, "Not implements.");
  };

  BlockTxDataStruct result;
  result = ExecuteStructApi<BlockTxRequestStruct, BlockTxDataStruct>(
      request, call_func, std::string(__FUNCTION__));
  return result;
}